

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbageSubdivMesh
          (int hash,size_t numFaces,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  undefined8 uVar2;
  BBox1f time_range;
  ulong uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  size_t sVar6;
  reference pvVar7;
  unsigned_long *puVar8;
  Vec3fa *pVVar9;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  float w;
  float z;
  float y;
  float x;
  size_t j;
  uint f;
  size_t i;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh;
  RandomSampler sampler;
  uint hash_1;
  anon_union_4_2_947300a4 v_8;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  Vec3fa v_9;
  Vec3fa v_4;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_3;
  uint m_3;
  uint n_4;
  uint m_4;
  uint n_5;
  uint m_5;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  uint n_11;
  uint m_11;
  uint n_1;
  uint m_1;
  uint n_2;
  uint m_2;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_8;
  size_t i_7;
  Vec3fa *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  SubdivMeshNode *in_stack_fffffffffffff918;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff920;
  value_type_conflict2 *in_stack_fffffffffffff928;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff9f0;
  SubdivMeshNode *in_stack_fffffffffffff9f8;
  float in_stack_fffffffffffffa00;
  float in_stack_fffffffffffffa04;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  uint local_578;
  uint local_574;
  uint local_570;
  uint local_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  uint local_53c;
  uint local_538;
  uint local_534;
  uint local_530;
  uint local_52c;
  ulong local_528;
  uint local_51c;
  ulong local_518;
  undefined1 local_50d;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 uStack_500;
  long *local_4f0;
  _func_int **local_4e8;
  uint local_4dc [4];
  byte local_4c9;
  ulong local_4c8;
  long **local_4a8;
  undefined4 *local_4a0;
  undefined4 *local_498;
  undefined4 *local_490;
  long **local_488;
  _func_int **local_478;
  _func_int ***local_470;
  _func_int ***local_468;
  _func_int ***local_460;
  _func_int ***local_458;
  _func_int ***local_450;
  _func_int ***local_448;
  _func_int ***local_440;
  _func_int ***local_430;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  uint local_400;
  uint *local_3f8;
  uint *local_3f0;
  uint *local_3e8;
  uint *local_3e0;
  uint *local_3d8;
  uint *local_3d0;
  uint *local_3c8;
  uint *local_3c0;
  uint *local_3b8;
  uint *local_3b0;
  uint *local_3a8;
  uint *local_3a0;
  uint local_398;
  uint local_394;
  uint local_390;
  uint local_38c;
  uint local_388;
  uint local_384;
  uint local_380;
  uint local_37c;
  uint local_378;
  uint local_374;
  uint local_370;
  uint local_36c;
  uint local_368;
  uint local_364;
  uint local_360;
  uint local_35c;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  undefined8 *local_348;
  uint local_340;
  uint local_33c;
  uint local_338;
  uint local_334;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_318;
  reference local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  Vec3fa *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d8;
  reference local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  Vec3fa *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  undefined4 local_204;
  undefined4 local_200;
  uint local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  uint local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  int local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  uint local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  int local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  int local_19c;
  undefined4 local_198;
  undefined4 local_194;
  uint local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint local_184;
  ulong local_180;
  ulong local_178;
  Vec3fa *local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  reference local_148;
  Vec3fa *local_140;
  Vec3fa *local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  Vec3fa *local_118;
  reference local_110;
  size_t local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fa *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  Vec3fa *local_a8;
  Vec3fa *local_a0;
  size_t local_98;
  Vec3fa *local_90;
  reference local_88;
  size_t local_80;
  reference local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  ulong local_58;
  reference local_50;
  size_t local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_4c9 = in_CL & 1;
  local_3f8 = local_4dc;
  local_214 = 0xcc9e2d51;
  local_218 = 0x1b873593;
  local_21c = 0xf;
  local_220 = 0xd;
  local_224 = 5;
  local_228 = 0xe6546b64;
  uVar4 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_210 = uVar4 * 0x1b873593;
  local_20c = (uVar4 * -0x194da000 | local_210 >> 0x13) * 5 + 0xe6546b64;
  uVar4 = (local_20c >> 0x10 ^ local_20c) * -0x7a143595;
  local_400 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
  local_400 = local_400 >> 0x10 ^ local_400;
  local_4c8 = in_RDX;
  local_208 = local_400;
  local_4dc[0] = local_400;
  pp_Var5 = (_func_int **)::operator_new(0x1b0);
  local_50d = 1;
  local_4a8 = &local_4f0;
  local_4f0 = (long *)*in_R8;
  if (local_4f0 != (long *)0x0) {
    (**(code **)(*local_4f0 + 0x10))();
  }
  local_508 = 0;
  local_50c = 0x3f800000;
  local_490 = &local_504;
  local_498 = &local_508;
  local_4a0 = &local_50c;
  local_504 = 0;
  uStack_500 = 0x3f800000;
  time_range.upper = in_stack_fffffffffffffa04;
  time_range.lower = in_stack_fffffffffffffa00;
  SubdivMeshNode::SubdivMeshNode
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,time_range,
             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_50d = 0;
  local_470 = &local_4e8;
  local_478 = pp_Var5;
  local_4e8 = pp_Var5;
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 0x10))();
  }
  local_488 = &local_4f0;
  if (local_4f0 != (long *)0x0) {
    (**(code **)(*local_4f0 + 0x18))();
  }
  for (local_518 = 0; local_518 < local_4c8; local_518 = local_518 + 1) {
    local_3e8 = local_4dc;
    local_190 = local_4dc[0];
    local_194 = 0x19660d;
    local_198 = 0x3c6ef35f;
    local_51c = (local_4dc[0] >> 1) % 0x14;
    local_448 = &local_4e8;
    local_4dc[0] = local_4dc[0] * 0x19660d + 0x3c6ef35f;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    for (local_528 = 0; local_528 < local_51c; local_528 = local_528 + 1) {
      local_450 = &local_4e8;
      local_3f0 = local_4dc;
      local_184 = local_4dc[0];
      local_188 = 0x19660d;
      local_18c = 0x3c6ef35f;
      uVar4 = local_4dc[0] * 0x19660d + 0x3c6ef35f;
      if ((local_4dc[0] >> 1) % 0x20 == 0) {
        local_3a0 = local_4dc;
        local_200 = 0x19660d;
        local_204 = 0x3c6ef35f;
        local_52c = local_4dc[0];
        local_1fc = uVar4;
        local_4dc[0] = uVar4 * 0x19660d + 0x3c6ef35f;
      }
      else {
        local_458 = &local_4e8;
        local_4dc[0] = uVar4;
        sVar6 = SubdivMeshNode::numPositions(in_stack_fffffffffffff918);
        local_52c = (uint)sVar6;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffff920,(value_type_conflict2 *)in_stack_fffffffffffff918);
      local_3a8 = local_4dc;
      local_1f0 = local_4dc[0];
      local_1f4 = 0x19660d;
      local_1f8 = 0x3c6ef35f;
      local_1e4 = local_4dc[0] * 0x19660d + 0x3c6ef35f;
      local_530 = local_4dc[0];
      local_3b0 = local_4dc;
      local_1e8 = 0x19660d;
      local_1ec = 0x3c6ef35f;
      local_1d8 = local_1e4 * 0x19660d + 0x3c6ef35f;
      local_534 = local_4dc[0];
      local_3b8 = local_4dc;
      local_1dc = 0x19660d;
      local_1e0 = 0x3c6ef35f;
      local_1cc = local_1d8 * 0x19660d + 0x3c6ef35f;
      local_538 = local_4dc[0];
      local_3c0 = local_4dc;
      local_1d0 = 0x19660d;
      local_1d4 = 0x3c6ef35f;
      local_53c = local_4dc[0];
      local_460 = &local_4e8;
      local_378 = local_53c;
      local_374 = local_53c;
      local_370 = local_538;
      local_36c = local_538;
      local_368 = local_534;
      local_364 = local_534;
      local_360 = local_530;
      local_35c = local_530;
      local_4dc[0] = local_1cc * 0x19660d + 0x3c6ef35f;
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(local_4e8 + 0xe),0);
      local_348 = &local_568;
      local_34c = local_530;
      local_350 = local_534;
      local_354 = local_538;
      local_358 = local_53c;
      local_22c = local_53c;
      local_230 = local_538;
      local_234 = local_534;
      local_238 = local_530;
      local_2a8 = CONCAT44(local_534,local_530);
      uStack_2a0 = CONCAT44(local_53c,local_538);
      local_408 = &local_558;
      local_410 = &local_568;
      local_290 = &local_558;
      local_2d8 = &local_558;
      local_2c0 = &local_2e8;
      uVar1 = pvVar7->size_active;
      local_58 = pvVar7->size_active + 1;
      local_2d0 = pvVar7;
      local_2c8 = local_2d8;
      local_248 = local_2a8;
      uStack_240 = uStack_2a0;
      local_50 = pvVar7;
      local_568 = local_2a8;
      uStack_560 = uStack_2a0;
      local_558 = local_2a8;
      uStack_550 = uStack_2a0;
      local_2e8 = local_2a8;
      uStack_2e0 = uStack_2a0;
      if (pvVar7->size_alloced < local_58) {
        sVar6 = local_58;
        if (pvVar7->size_alloced != 0) {
          local_60 = pvVar7->size_alloced;
          while (local_60 < local_58) {
            local_70[1] = 1;
            local_70[0] = local_60 << 1;
            puVar8 = std::max<unsigned_long>(local_70 + 1,local_70);
            local_60 = *puVar8;
          }
          local_48 = local_60;
          sVar6 = local_48;
        }
      }
      else {
        sVar6 = pvVar7->size_alloced;
      }
      local_48 = sVar6;
      local_158 = local_48;
      uVar3 = uVar1;
      if (uVar1 < pvVar7->size_active) {
        while (local_160 = uVar3, local_160 < pvVar7->size_active) {
          uVar3 = local_160 + 1;
        }
        pvVar7->size_active = uVar1;
      }
      local_150 = uVar1;
      local_148 = pvVar7;
      if (local_48 == pvVar7->size_alloced) {
        for (local_168 = pvVar7->size_active; local_168 < uVar1; local_168 = local_168 + 1) {
          local_140 = pvVar7->items + local_168;
        }
        pvVar7->size_active = uVar1;
      }
      else {
        local_170 = pvVar7->items;
        local_108 = local_48;
        local_100 = pvVar7;
        pVVar9 = (Vec3fa *)
                 alignedMalloc((size_t)in_stack_fffffffffffff928,(size_t)in_stack_fffffffffffff920);
        pvVar7->items = pVVar9;
        for (local_178 = 0; local_178 < pvVar7->size_active; local_178 = local_178 + 1) {
          local_128 = pvVar7->items + local_178;
          local_130 = local_170 + local_178;
          uVar2 = *(undefined8 *)((long)&local_130->field_0 + 8);
          *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
          *(undefined8 *)((long)&local_128->field_0 + 8) = uVar2;
        }
        for (local_180 = pvVar7->size_active; local_180 < local_150; local_180 = local_180 + 1) {
          local_138 = pvVar7->items + local_180;
        }
        local_120 = pvVar7->size_alloced;
        local_118 = local_170;
        local_110 = pvVar7;
        alignedFree(in_stack_fffffffffffff918);
        pvVar7->size_active = local_150;
        pvVar7->size_alloced = local_158;
      }
      sVar6 = pvVar7->size_active;
      pvVar7->size_active = sVar6 + 1;
      local_2b0 = pvVar7->items + sVar6;
      local_2b8 = &local_2e8;
      *(undefined8 *)&local_2b0->field_0 = local_2e8;
      *(undefined8 *)((long)&local_2b0->field_0 + 8) = uStack_2e0;
      if ((local_4c9 & 1) != 0) {
        local_3c8 = local_4dc;
        local_1c0 = local_4dc[0];
        local_1c4 = 0x19660d;
        local_1c8 = 0x3c6ef35f;
        local_1b4 = local_4dc[0] * 0x19660d + 0x3c6ef35f;
        local_56c = local_4dc[0];
        local_3d0 = local_4dc;
        local_1b8 = 0x19660d;
        local_1bc = 0x3c6ef35f;
        local_1a8 = local_1b4 * 0x19660d + 0x3c6ef35f;
        local_570 = local_4dc[0];
        local_3d8 = local_4dc;
        local_1ac = 0x19660d;
        local_1b0 = 0x3c6ef35f;
        local_19c = local_1a8 * 0x19660d + 0x3c6ef35f;
        local_574 = local_4dc[0];
        local_3e0 = local_4dc;
        local_1a0 = 0x19660d;
        local_1a4 = 0x3c6ef35f;
        local_578 = local_4dc[0];
        local_468 = &local_4e8;
        local_398 = local_578;
        local_394 = local_578;
        local_390 = local_574;
        local_38c = local_574;
        local_388 = local_570;
        local_384 = local_570;
        local_380 = local_56c;
        local_37c = local_56c;
        local_4dc[0] = local_19c * 0x19660d + 0x3c6ef35f;
        pvVar7 = std::
                 vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)(local_4e8 + 0xe),1);
        local_330 = &local_598;
        local_334 = local_56c;
        local_338 = local_570;
        local_33c = local_574;
        local_340 = local_578;
        local_24c = local_578;
        local_250 = local_574;
        local_254 = local_570;
        local_258 = local_56c;
        local_288 = CONCAT44(local_570,local_56c);
        uStack_280 = CONCAT44(local_578,local_574);
        local_418 = &local_588;
        local_420 = &local_598;
        local_270 = &local_588;
        local_318 = &local_588;
        local_300 = &local_328;
        uVar1 = pvVar7->size_active;
        local_28 = pvVar7->size_active + 1;
        local_310 = pvVar7;
        local_308 = local_318;
        local_268 = local_288;
        uStack_260 = uStack_280;
        local_20 = pvVar7;
        local_598 = local_288;
        uStack_590 = uStack_280;
        local_588 = local_288;
        uStack_580 = uStack_280;
        local_328 = local_288;
        uStack_320 = uStack_280;
        if (pvVar7->size_alloced < local_28) {
          sVar6 = local_28;
          if (pvVar7->size_alloced != 0) {
            local_30 = pvVar7->size_alloced;
            while (local_30 < local_28) {
              local_40[1] = 1;
              local_40[0] = local_30 << 1;
              puVar8 = std::max<unsigned_long>(local_40 + 1,local_40);
              local_30 = *puVar8;
            }
            local_18 = local_30;
            sVar6 = local_18;
          }
        }
        else {
          sVar6 = pvVar7->size_alloced;
        }
        local_18 = sVar6;
        local_d0 = local_18;
        uVar3 = uVar1;
        if (uVar1 < pvVar7->size_active) {
          while (local_d8 = uVar3, local_d8 < pvVar7->size_active) {
            uVar3 = local_d8 + 1;
          }
          pvVar7->size_active = uVar1;
        }
        local_c8 = uVar1;
        local_c0 = pvVar7;
        if (local_18 == pvVar7->size_alloced) {
          for (local_e0 = pvVar7->size_active; local_e0 < uVar1; local_e0 = local_e0 + 1) {
            local_b8 = pvVar7->items + local_e0;
          }
          pvVar7->size_active = uVar1;
        }
        else {
          local_e8 = pvVar7->items;
          local_80 = local_18;
          local_78 = pvVar7;
          pVVar9 = (Vec3fa *)
                   alignedMalloc((size_t)in_stack_fffffffffffff928,(size_t)in_stack_fffffffffffff920
                                );
          pvVar7->items = pVVar9;
          for (local_f0 = 0; local_f0 < pvVar7->size_active; local_f0 = local_f0 + 1) {
            local_a0 = pvVar7->items + local_f0;
            local_a8 = local_e8 + local_f0;
            uVar2 = *(undefined8 *)((long)&local_a8->field_0 + 8);
            *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
            *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar2;
          }
          for (local_f8 = pvVar7->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
            local_b0 = pvVar7->items + local_f8;
          }
          local_98 = pvVar7->size_alloced;
          local_90 = local_e8;
          local_88 = pvVar7;
          alignedFree(in_stack_fffffffffffff918);
          pvVar7->size_active = local_c8;
          pvVar7->size_alloced = local_d0;
        }
        sVar6 = pvVar7->size_active;
        pvVar7->size_active = sVar6 + 1;
        local_2f0 = pvVar7->items + sVar6;
        local_2f8 = &local_328;
        *(undefined8 *)&local_2f0->field_0 = local_328;
        *(undefined8 *)((long)&local_2f0->field_0 + 8) = uStack_320;
      }
    }
  }
  local_440 = &local_4e8;
  local_10 = local_4e8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_4e8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_430 = &local_4e8;
  if (local_4e8 != (_func_int **)0x0) {
    (**(code **)(*local_4e8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageSubdivMesh (int hash, size_t numFaces, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),mblur?2:1);

    for (size_t i=0; i<numFaces; i++) 
    {
      const unsigned f = RandomSampler_getInt(sampler) % 20;
      mesh->verticesPerFace.push_back(f);
      for (size_t j=0; j<f; j++) 
      {
        mesh->position_indices.push_back((RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(mesh->numPositions()));

        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[0].push_back(Vec3fa(Vec3ff(x,y,z,w)));

        if (mblur) 
        {
          const float x = cast_i2f(RandomSampler_getUInt(sampler));
          const float y = cast_i2f(RandomSampler_getUInt(sampler));
          const float z = cast_i2f(RandomSampler_getUInt(sampler));
          const float w = cast_i2f(RandomSampler_getUInt(sampler));
          mesh->positions[1].push_back(Vec3fa(Vec3ff(x,y,z,w)));
        }
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }